

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase263::run(TestCase263 *this)

{
  Reader reader_00;
  Builder builder_00;
  word *pwVar1;
  size_t sVar2;
  size_t in_RCX;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  Array<capnp::word> serialized;
  TestInputStream stream;
  InputStreamMessageReader reader;
  TestMessageBuilder builder;
  Array<capnp::word> local_318;
  PointerReader local_2f8;
  StructBuilder local_2d0;
  InputStream local_2a8;
  word *local_2a0;
  word *local_298;
  undefined1 local_290;
  Reader local_288;
  StructReader local_268;
  SegmentBuilder *local_238;
  undefined1 in_stack_fffffffffffffde0 [24];
  TestMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_0036d5d0;
  local_100.desiredSegmentCount = 1;
  MessageBuilder::getRootInternal((Builder *)&local_2f8,(MessageBuilder *)&local_100);
  local_238 = (SegmentBuilder *)local_2f8.segment;
  PointerBuilder::initStruct(&local_2d0,(PointerBuilder *)&local_238,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)local_2f8.pointer;
  builder_00._builder.segment = (SegmentBuilder *)local_2f8.capTable;
  builder_00._builder.data = (void *)in_stack_fffffffffffffde0._0_8_;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffde0._8_8_;
  builder_00._builder.dataSize = in_stack_fffffffffffffde0._16_4_;
  builder_00._builder.pointerCount = in_stack_fffffffffffffde0._20_2_;
  builder_00._builder._38_2_ = in_stack_fffffffffffffde0._22_2_;
  initTestMessage(builder_00);
  AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar3.size_;
  segments.size_ = in_RCX;
  messageToFlatArray(&local_318,(capnp *)AVar3.ptr,segments);
  local_2a8._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_0036d6a0;
  local_2a0 = local_318.ptr;
  local_298 = local_318.ptr + local_318.size_;
  local_290 = 1;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  InputStreamMessageReader::InputStreamMessageReader
            ((InputStreamMessageReader *)&local_238,&local_2a8,options,
             (ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal(&local_288,(MessageReader *)&local_238);
  local_2f8.pointer = local_288.reader.pointer;
  local_2f8.nestingLimit = local_288.reader.nestingLimit;
  local_2f8._28_4_ = local_288.reader._28_4_;
  local_2f8.segment = local_288.reader.segment;
  local_2f8.capTable = local_288.reader.capTable;
  PointerReader::getStruct(&local_268,&local_2f8,(word *)0x0);
  reader_00._reader.capTable = local_268.capTable;
  reader_00._reader.segment = local_268.segment;
  reader_00._reader.data = local_268.data;
  reader_00._reader.pointers = local_268.pointers;
  reader_00._reader.dataSize = local_268.dataSize;
  reader_00._reader.pointerCount = local_268.pointerCount;
  reader_00._reader._38_2_ = local_268._38_2_;
  reader_00._reader.nestingLimit = local_268.nestingLimit;
  reader_00._reader._44_4_ = local_268._44_4_;
  checkTestMessage(reader_00);
  InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)&local_238);
  kj::BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&local_2a8);
  sVar2 = local_318.size_;
  pwVar1 = local_318.ptr;
  if (local_318.ptr != (word *)0x0) {
    local_318.ptr = (word *)0x0;
    local_318.size_ = 0;
    (*(code *)**(undefined8 **)local_318.disposer)(local_318.disposer,pwVar1,8,sVar2,sVar2,0);
  }
  TestMessageBuilder::~TestMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Serialize, InputStreamLazy) {
  TestMessageBuilder builder(1);
  initTestMessage(builder.initRoot<TestAllTypes>());

  kj::Array<word> serialized = messageToFlatArray(builder);

  TestInputStream stream(serialized.asPtr(), true);
  InputStreamMessageReader reader(stream, ReaderOptions());

  checkTestMessage(reader.getRoot<TestAllTypes>());
}